

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O0

void avl_remove(avl_tree *tree,avl_node *node)

{
  avl_node *paVar1;
  int iVar2;
  int iVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  avl_node *paVar6;
  avl_node *in_RSI;
  ulong *in_RDI;
  int bf_old;
  int bf;
  avl_node *next;
  avl_node *cur;
  avl_node *p;
  avl_tree right_subtree;
  int local_3c;
  avl_tree local_20;
  avl_node *local_10;
  ulong *local_8;
  
  if (in_RSI != (avl_node *)0x0) {
    local_3c = 0;
    local_20.root = in_RSI->right;
    local_10 = in_RSI;
    local_8 = in_RDI;
    paVar4 = avl_first(&local_20);
    if (paVar4 == (avl_node *)0x0) {
      paVar6 = (avl_node *)((ulong)local_10->parent & 0xfffffffffffffffc);
      if (paVar6 != (avl_node *)0x0) {
        if (paVar6->left == local_10) {
          paVar6->left = local_10->left;
          local_3c = 1;
        }
        else {
          paVar6->right = local_10->left;
          local_3c = -1;
        }
      }
      if (local_10->left != (avl_node *)0x0) {
        avl_set_parent(local_10->left,paVar6);
      }
      paVar6 = (avl_node *)((ulong)local_10->parent & 0xfffffffffffffffc);
    }
    else {
      if (((((ulong)paVar4->parent & 0xfffffffffffffffc) != 0) &&
          ((avl_node *)((ulong)paVar4->parent & 0xfffffffffffffffc) != local_10)) &&
         (*(avl_node **)(((ulong)paVar4->parent & 0xfffffffffffffffc) + 8) = paVar4->right,
         paVar4->right != (avl_node *)0x0)) {
        avl_set_parent(paVar4->right,(avl_node *)((ulong)paVar4->parent & 0xfffffffffffffffc));
      }
      if (((ulong)local_10->parent & 0xfffffffffffffffc) != 0) {
        if (*(avl_node **)(((ulong)local_10->parent & 0xfffffffffffffffc) + 8) == local_10) {
          *(avl_node **)(((ulong)local_10->parent & 0xfffffffffffffffc) + 8) = paVar4;
        }
        else {
          *(avl_node **)(((ulong)local_10->parent & 0xfffffffffffffffc) + 0x10) = paVar4;
        }
      }
      if (local_10->right == paVar4) {
        local_3c = -1;
        paVar6 = paVar4;
      }
      else {
        paVar4->right = local_10->right;
        if (local_10->right != (avl_node *)0x0) {
          avl_set_parent(local_10->right,paVar4);
        }
        local_3c = 1;
        paVar6 = (avl_node *)((ulong)paVar4->parent & 0xfffffffffffffffc);
      }
      paVar4->left = local_10->left;
      if (local_10->left != (avl_node *)0x0) {
        avl_set_parent(local_10->left,paVar4);
      }
      avl_set_parent(paVar4,(avl_node *)((ulong)local_10->parent & 0xfffffffffffffffc));
      avl_set_bf(paVar4,((uint)local_10->parent & 3) - 1);
    }
    if ((((avl_node *)*local_8 == local_10) && (*local_8 = (ulong)paVar4, paVar4 == (avl_node *)0x0)
        ) && (local_10->left != (avl_node *)0x0)) {
      *local_8 = (ulong)local_10->left;
    }
    do {
      if (paVar6 == (avl_node *)0x0) {
        return;
      }
      paVar5 = (avl_node *)((ulong)paVar6->parent & 0xfffffffffffffffc);
      iVar2 = (int)((ulong)paVar4 >> 0x20);
      if (paVar5 == (avl_node *)0x0) {
        if (paVar6 == (avl_node *)*local_8) {
          paVar4 = _balance_tree(paVar6,iVar2);
          *local_8 = (ulong)paVar4;
          return;
        }
      }
      else {
        paVar1 = paVar6->parent;
        if (paVar5->right == paVar6) {
          paVar6 = _balance_tree(paVar6,iVar2);
          paVar5->right = paVar6;
        }
        else {
          paVar6 = _balance_tree(paVar6,iVar2);
          paVar5->left = paVar6;
        }
        if ((paVar6->left == (avl_node *)0x0) && (paVar6->right == (avl_node *)0x0)) {
          if (paVar5->left == paVar6) {
            local_3c = 1;
          }
          else {
            local_3c = -1;
          }
        }
        else {
          local_3c = 0;
          iVar2 = _abs(((uint)paVar1 & 3) - 1);
          iVar3 = _abs(((uint)paVar6->parent & 3) - 1);
          if (iVar3 < iVar2) {
            if (paVar5->left == paVar6) {
              local_3c = 1;
            }
            else {
              local_3c = -1;
            }
          }
        }
      }
      paVar6 = paVar5;
    } while (local_3c != 0);
  }
  return;
}

Assistant:

void avl_remove(struct avl_tree *tree,
                struct avl_node *node)
{
    __AVL_DEBUG_REMOVE(node);

    // not found
    if (node == NULL) return;

    struct avl_tree right_subtree;
    struct avl_node *p=NULL,*cur, *next=NULL;
    int bf = 0, bf_old;


#ifdef _AVL_NEXT_POINTER
    if (node->prev) node->prev->next = node->next;
    if (node->next) node->next->prev = node->prev;
#endif

    // find smallest node in right sub-tree
    right_subtree.root = node->right;
    next = avl_first(&right_subtree);

    if (next) {
        // 1. NEXT exists
        if (avl_parent(next)) {
            if (avl_parent(next) != node) {
                // NODE is not NEXT's direct parent
                // MUST ensure NEXT should be *left child* of its parent
                // MUST ensure NEXT doesn't have right child
                avl_parent(next)->left = next->right;
                if (next->right)
                    avl_set_parent(next->right, avl_parent(next));
            }
        }
        if (avl_parent(node)) {
            // replace NODE by NEXT
            if (avl_parent(node)->left == node) {
                avl_parent(node)->left = next;
            } else {
                avl_parent(node)->right = next;
            }
        }

        // re-link pointers
        if (node->right != next) {
            next->right = node->right;
            if (node->right) avl_set_parent(node->right, next);
            cur = avl_parent(next);
            bf = 1;
        }else{
            cur = next;
            bf = -1;
        }

        next->left = node->left;
        if (node->left) avl_set_parent(node->left, next);
        avl_set_parent(next, avl_parent(node));

        // inherit NODE's balance factor
        avl_set_bf(next, avl_bf(node));

    } else {
        // 2. NEXT == NULL (only when there's no right sub-tree)
        p = avl_parent(node);
        if (p) {
            if (p->left == node) {
                p->left = node->left;
                bf = 1;
            } else {
                p->right = node->left;
                bf = -1;
            }
        }
        if (node->left)
            avl_set_parent(node->left, p);

        cur = avl_parent(node);
    }

    // reset root
    if (tree->root == node) {
        tree->root = next;
        if (next == NULL) {
            if (node->left) tree->root = node->left;
        }
    }

    // recursive balancing process .. scan from CUR to root
    while(cur) {
        p = avl_parent(cur);
        if (p) {
            // if parent exists
            bf_old = avl_bf(cur);

            if (p->right == cur) {
                cur = _balance_tree(cur, bf);
                p->right = cur;
            }else {
                cur = _balance_tree(cur, bf);
                p->left = cur;
            }

            // calculate balance facter BF for parent
            if (cur->left == NULL && cur->right == NULL) {
                // leaf node
                if (p->left == cur) bf = 1;
                else bf = -1;
            } else {
                // index ndoe
                bf = 0;
                if (_abs(bf_old) > _abs(avl_bf(cur))) {
                    // if ABS of balance factor decreases
                    // cascade to parent
                    if (p->left == cur) bf = 1;
                    else bf = -1;
                }
            }

        } else if(cur == tree->root){
            tree->root = _balance_tree(tree->root, bf);
            break;
        }
        if (bf == 0) break;

        cur = p;
    }

    __AVL_DEBUG_DISPLAY(tree);
}